

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

value object_await(object obj,method m,void **args,size_t size,
                  object_resolve_callback resolve_callback,object_reject_callback reject_callback,
                  void *context)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  method_conflict in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  value v;
  value local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x20) == 0)) {
    local_8 = (value)0x0;
  }
  else {
    local_8 = (value)(**(code **)(in_RDI[3] + 0x20))(in_RDI,in_RDI[2],in_RSI,in_RDX,in_RCX,in_R8);
    if (local_8 == (value)0x0) {
      uVar1 = *in_RDI;
      pcVar2 = method_name(in_RSI);
      log_write_impl_va("metacall",0x161,"object_await",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object %s await of method %s",uVar1,pcVar2);
      local_8 = (value)0x0;
    }
  }
  return local_8;
}

Assistant:

value object_await(object obj, method m, object_args args, size_t size, object_resolve_callback resolve_callback, object_reject_callback reject_callback, void *context)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->method_await != NULL)
	{
		value v = obj->interface->method_await(obj, obj->impl, m, args, size, resolve_callback, reject_callback, context);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s await of method %s", obj->name, method_name(m));

			return NULL;
		}

		return v;
	}

	return NULL;
}